

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

int hts_idx_load_core(hts_idx_t *idx,void *fp,int fmt)

{
  khint_t kVar1;
  long lVar2;
  bins_t *p_00;
  hts_pair64_t *phVar3;
  void *pvVar4;
  int local_68;
  int j_1;
  khint_t k;
  bins_t *p;
  int local_50;
  int absent;
  int j;
  uint32_t key;
  lidx_t *l;
  bidx_t *h;
  int local_30;
  int is_bgzf;
  int32_t is_be;
  int32_t n;
  int32_t i;
  int fmt_local;
  void *fp_local;
  hts_idx_t *idx_local;
  
  h._4_4_ = (uint)(fmt != 1);
  n = fmt;
  _i = fp;
  fp_local = idx;
  local_30 = ed_is_big();
  if (fp_local == (void *)0x0) {
    idx_local._4_4_ = -4;
  }
  else {
    for (is_be = 0; is_be < *(int *)((long)fp_local + 0x14); is_be = is_be + 1) {
      _j = (int *)(*(long *)((long)fp_local + 0x30) + (long)is_be * 0x10);
      l = (lidx_t *)kh_init_bin();
      *(lidx_t **)(*(long *)((long)fp_local + 0x28) + (long)is_be * 8) = l;
      lVar2 = idx_read(h._4_4_,_i,&is_bgzf,4);
      if (lVar2 != 4) {
        return -1;
      }
      if (local_30 != 0) {
        ed_swap_4p(&is_bgzf);
      }
      for (local_50 = 0; local_50 < is_bgzf; local_50 = local_50 + 1) {
        lVar2 = idx_read(h._4_4_,_i,&absent,4);
        if (lVar2 != 4) {
          return -1;
        }
        if (local_30 != 0) {
          ed_swap_4p(&absent);
        }
        kVar1 = kh_put_bin((kh_bin_t *)l,absent,(int *)((long)&p + 4));
        if (p._4_4_ < 1) {
          return -3;
        }
        p_00 = (bins_t *)(*(long *)(l + 2) + (ulong)kVar1 * 0x18);
        if (n == 0) {
          lVar2 = idx_read(h._4_4_,_i,&p_00->loff,8);
          if (lVar2 != 8) {
            return -1;
          }
          if (local_30 != 0) {
            ed_swap_8p(&p_00->loff);
          }
        }
        else {
          p_00->loff = 0;
        }
        lVar2 = idx_read(h._4_4_,_i,&p_00->n,4);
        if (lVar2 != 4) {
          return -1;
        }
        if (local_30 != 0) {
          ed_swap_4p(&p_00->n);
        }
        p_00->m = p_00->n;
        phVar3 = (hts_pair64_t *)malloc((long)p_00->m << 4);
        p_00->list = phVar3;
        if (p_00->list == (hts_pair64_t *)0x0) {
          return -2;
        }
        lVar2 = idx_read(h._4_4_,_i,p_00->list,(long)(p_00->n << 4));
        if (lVar2 != p_00->n << 4) {
          return -1;
        }
        if (local_30 != 0) {
          swap_bins(p_00);
        }
      }
      if (n != 0) {
        lVar2 = idx_read(h._4_4_,_i,_j,4);
        if (lVar2 != 4) {
          return -1;
        }
        if (local_30 != 0) {
          ed_swap_4p(_j);
        }
        _j[1] = *_j;
        pvVar4 = malloc((long)*_j << 3);
        *(void **)(_j + 2) = pvVar4;
        if (*(long *)(_j + 2) == 0) {
          return -2;
        }
        lVar2 = idx_read(h._4_4_,_i,*(void **)(_j + 2),(long)(*_j << 3));
        if (lVar2 != *_j << 3) {
          return -1;
        }
        if (local_30 != 0) {
          for (local_68 = 0; local_68 < *_j; local_68 = local_68 + 1) {
            ed_swap_8p((void *)(*(long *)(_j + 2) + (long)local_68 * 8));
          }
        }
        for (local_68 = 1; local_68 < *_j; local_68 = local_68 + 1) {
          if (*(long *)(*(long *)(_j + 2) + (long)local_68 * 8) == 0) {
            *(undefined8 *)(*(long *)(_j + 2) + (long)local_68 * 8) =
                 *(undefined8 *)(*(long *)(_j + 2) + (long)(local_68 + -1) * 8);
          }
        }
        update_loff((hts_idx_t *)fp_local,is_be,1);
      }
    }
    lVar2 = idx_read(h._4_4_,_i,(void *)((long)fp_local + 0x20),8);
    if (lVar2 != 8) {
      *(undefined8 *)((long)fp_local + 0x20) = 0;
    }
    if (local_30 != 0) {
      ed_swap_8p((void *)((long)fp_local + 0x20));
    }
    idx_local._4_4_ = 0;
  }
  return idx_local._4_4_;
}

Assistant:

static int hts_idx_load_core(hts_idx_t *idx, void *fp, int fmt)
{
    int32_t i, n, is_be;
    int is_bgzf = (fmt != HTS_FMT_BAI);
    is_be = ed_is_big();
    if (idx == NULL) return -4;
    for (i = 0; i < idx->n; ++i) {
        bidx_t *h;
        lidx_t *l = &idx->lidx[i];
        uint32_t key;
        int j, absent;
        bins_t *p;
        h = idx->bidx[i] = kh_init(bin);
        if (idx_read(is_bgzf, fp, &n, 4) != 4) return -1;
        if (is_be) ed_swap_4p(&n);
        for (j = 0; j < n; ++j) {
            khint_t k;
            if (idx_read(is_bgzf, fp, &key, 4) != 4) return -1;
            if (is_be) ed_swap_4p(&key);
            k = kh_put(bin, h, key, &absent);
            if (absent <= 0) return -3; // Duplicate bin number
            p = &kh_val(h, k);
            if (fmt == HTS_FMT_CSI) {
                if (idx_read(is_bgzf, fp, &p->loff, 8) != 8) return -1;
                if (is_be) ed_swap_8p(&p->loff);
            } else p->loff = 0;
            if (idx_read(is_bgzf, fp, &p->n, 4) != 4) return -1;
            if (is_be) ed_swap_4p(&p->n);
            p->m = p->n;
            p->list = (hts_pair64_t*)malloc(p->m * sizeof(hts_pair64_t));
            if (p->list == NULL) return -2;
            if (idx_read(is_bgzf, fp, p->list, p->n<<4) != p->n<<4) return -1;
            if (is_be) swap_bins(p);
        }
        if (fmt != HTS_FMT_CSI) { // load linear index
            int j;
            if (idx_read(is_bgzf, fp, &l->n, 4) != 4) return -1;
            if (is_be) ed_swap_4p(&l->n);
            l->m = l->n;
            l->offset = (uint64_t*)malloc(l->n * sizeof(uint64_t));
            if (l->offset == NULL) return -2;
            if (idx_read(is_bgzf, fp, l->offset, l->n << 3) != l->n << 3) return -1;
            if (is_be) for (j = 0; j < l->n; ++j) ed_swap_8p(&l->offset[j]);
            for (j = 1; j < l->n; ++j) // fill missing values; may happen given older samtools and tabix
                if (l->offset[j] == 0) l->offset[j] = l->offset[j-1];
            update_loff(idx, i, 1);
        }
    }
    if (idx_read(is_bgzf, fp, &idx->n_no_coor, 8) != 8) idx->n_no_coor = 0;
    if (is_be) ed_swap_8p(&idx->n_no_coor);
    return 0;
}